

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::remove_children(Tree *this,size_t node)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  NodeData *pNVar4;
  Tree *in_RSI;
  size_t in_RDI;
  size_t next;
  char msg_1 [36];
  size_t ich;
  char msg [37];
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  char *in_stack_fffffffffffffef8;
  Location *in_stack_ffffffffffffff00;
  Tree *in_stack_ffffffffffffff38;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  size_t in_stack_ffffffffffffff68;
  Tree *in_stack_ffffffffffffff70;
  Tree *local_68;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  char *local_40;
  undefined1 local_38 [32];
  size_t in_stack_ffffffffffffffe8;
  
  pNVar4 = get(in_stack_ffffffffffffff38,in_RDI);
  if (pNVar4 == (NodeData *)0x0) {
    memcpy(local_38,"check failed: (get(node) != nullptr)",0x25);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                       CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                       CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    (*pcVar1)(local_38,0x25,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffee0 = uStack_58;
    in_stack_fffffffffffffee4 = uStack_54;
    in_stack_fffffffffffffee8 = local_50;
    in_stack_fffffffffffffeec = uStack_4c;
    in_stack_fffffffffffffef0 = uStack_48;
    in_stack_fffffffffffffef4 = uStack_44;
    in_stack_fffffffffffffef8 = local_40;
  }
  pNVar4 = get(in_stack_ffffffffffffff38,in_RDI);
  local_68 = (Tree *)pNVar4->m_first_child;
  do {
    if (local_68 == (Tree *)0xffffffffffffffff) {
      return;
    }
    remove_children(in_RSI,in_stack_ffffffffffffffe8);
    pNVar4 = get(in_stack_ffffffffffffff38,in_RDI);
    if (pNVar4 == (NodeData *)0x0) {
      memcpy(&stack0xffffffffffffff68,"check failed: (get(ich) != nullptr)",0x24);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x58);
      Location::Location(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                         CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                         CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      in_stack_fffffffffffffee0 = uStack_b8;
      in_stack_fffffffffffffee4 = uStack_b4;
      in_stack_fffffffffffffee8 = local_b0;
      in_stack_fffffffffffffeec = uStack_ac;
      in_stack_fffffffffffffef0 = uStack_a8;
      in_stack_fffffffffffffef4 = uStack_a4;
      in_stack_fffffffffffffef8 = local_a0;
      (*pcVar1)(&stack0xffffffffffffff68,0x24,*(undefined8 *)(in_RDI + 0x40));
    }
    pNVar4 = get(in_stack_ffffffffffffff38,in_RDI);
    in_stack_ffffffffffffff38 = (Tree *)pNVar4->m_next_sibling;
    _release(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    pNVar4 = get(in_stack_ffffffffffffff38,in_RDI);
    bVar2 = local_68 != (Tree *)pNVar4->m_last_child;
    local_68 = in_stack_ffffffffffffff38;
  } while (bVar2);
  return;
}

Assistant:

void Tree::remove_children(size_t node)
{
    _RYML_CB_ASSERT(m_callbacks, get(node) != nullptr);
    size_t ich = get(node)->m_first_child;
    while(ich != NONE)
    {
        remove_children(ich);
        _RYML_CB_ASSERT(m_callbacks, get(ich) != nullptr);
        size_t next = get(ich)->m_next_sibling;
        _release(ich);
        if(ich == get(node)->m_last_child)
            break;
        ich = next;
    }
}